

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
::internal_find<int>
          (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
           *this,int *key)

{
  btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *this_00;
  template_ElementType<2UL> *ptVar1;
  ulong uVar2;
  SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>,_false>
  SVar3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  bVar4;
  iterator iVar5;
  
  SVar3 = internal_locate_impl<int>();
  bVar4._8_8_ = SVar3.value._8_8_;
  bVar4.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)(ulong)(uint)SVar3.value.position;
  bVar4 = btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
          internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
                    ((btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                      *)SVar3.value.node,bVar4);
  this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
             *)bVar4.node;
  if (this_00 !=
      (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *)0x0)
  {
    uVar2 = (ulong)(uint)bVar4.position;
    ptVar1 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
             ::GetField<2ul>(this_00);
    if (ptVar1[bVar4.position] <= *key) goto LAB_0021a74d;
  }
  uVar2 = 0;
  this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
             *)0x0;
LAB_0021a74d:
  iVar5._8_8_ = uVar2;
  iVar5.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)this_00;
  return iVar5;
}

Assistant:

auto btree<P>::internal_find(const K &key) const -> iterator {
        auto res = internal_locate(key);
        if (res.HasMatch()) {
            if (res.IsEq()) {
                return res.value;
            }
        } else {
            const iterator iter = internal_last(res.value);
            if (iter.node != nullptr && !compare_keys(key, iter.key())) {
                return iter;
            }
        }
        return {nullptr, 0};
    }